

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdShrl(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  ctx->vmState->x86ShrlWrap = x86ShrlWrap;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uint)((ulong)cmd >> 0xd) & 0x7f8);
  GenCodeLoadInt32FromPointer(ctx,rEDX,rECX,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_sar64,rEAX,rECX);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,rEAX);
  return;
}

Assistant:

void GenCodeCmdShrl(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->x86ShrlWrap = x86ShrlWrap;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rB * 8); // Load lhs

	GenCodeLoadInt32FromPointer(ctx, rRDX, rECX, cmd.rC, cmd.argument); // Load lower int bits ot the rhs value

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_sar64, rRAX, rECX);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRAX); // Store long to target
#else
	// Load long RHS value into EAX:EDX
	x86GenCodeLoadInt64FromPointer(ctx, rEDX, rEAX, rEDX, cmd.rC, cmd.argument);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	// Load long LHS value into EAX:EDX
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rB * 8);
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rB * 8 + 4);

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_REG(ctx.ctx, o_push, rEAX);

	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->x86ShrlWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 16);

	// Send long in EAX:EDX
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, rEAX);
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8 + 4, rEDX);
#endif
}